

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttyio.c
# Opt level: O0

int ttwait(int msec)

{
  int iVar1;
  pollfd local_18;
  pollfd pfd [1];
  int msec_local;
  
  local_18.fd = 0;
  local_18.events = 1;
  pfd[0].fd = msec;
  iVar1 = poll(&local_18,1,msec);
  pfd[0]._5_3_ = 0;
  pfd[0].events._0_1_ = iVar1 == 0;
  pfd[0].revents = (short)(0 >> 8);
  iVar1._0_2_ = pfd[0].events;
  iVar1._2_2_ = pfd[0].revents;
  return iVar1;
}

Assistant:

int
ttwait(int msec)
{
	struct pollfd	pfd[1];

	pfd[0].fd = 0;
	pfd[0].events = POLLIN;

	if ((poll(pfd, 1, msec)) == 0)
		return (TRUE);
	return (FALSE);
}